

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O0

BasicBlock * __thiscall Loop::GetAnyTailBlock(Loop *this)

{
  code *pcVar1;
  FlowEdge **this_00;
  bool bVar2;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *this_01;
  undefined4 *puVar3;
  Type_conflict node;
  Type *ppFVar4;
  BasicBlock *pBVar5;
  BasicBlock *pred;
  FlowEdge **__edge;
  Iterator __iter;
  BasicBlock *loopHeader;
  BasicBlock *tail;
  Loop *this_local;
  
  loopHeader = (BasicBlock *)0x0;
  __iter.current = (NodeBase *)GetHeadBlock(this);
  this_01 = &BasicBlock::GetPredList((BasicBlock *)__iter.current)->
             super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
  ___edge = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::GetIterator(this_01);
  pBVar5 = loopHeader;
  while( true ) {
    loopHeader = pBVar5;
    if (__iter.list == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    this_00 = __edge;
    node = SListNodeBase<Memory::ArenaAllocator>::Next
                     (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    bVar2 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::IsHead
                      ((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)this_00,node);
    if (bVar2) break;
    SListNodeBase<Memory::ArenaAllocator>::Next
              (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    ppFVar4 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                        ((Iterator *)&__edge);
    pBVar5 = FlowEdge::GetPred(*ppFVar4);
    if (pBVar5 == (BasicBlock *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0xe61,"(pred)","pred");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    bVar2 = IsDescendentOrSelf(this,pBVar5->loop);
    if (!bVar2) {
      pBVar5 = loopHeader;
    }
  }
  if (loopHeader == (BasicBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0xe69,"(tail)","tail");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  return loopHeader;
}

Assistant:

BasicBlock *
Loop::GetAnyTailBlock() const
{
    BasicBlock * tail = nullptr;

    BasicBlock * loopHeader = this->GetHeadBlock();
    FOREACH_PREDECESSOR_BLOCK(pred, loopHeader)
    {
        if (this->IsDescendentOrSelf(pred->loop))
        {
            tail = pred;
        }
    } NEXT_PREDECESSOR_BLOCK;
    
    Assert(tail);
    return tail;
}